

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O3

double __thiscall HPreData::getaij(HPreData *this,int i,int j)

{
  pointer piVar1;
  pointer piVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  piVar1 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)piVar1[i];
  if (piVar2[lVar4] != j) {
    lVar7 = (long)piVar1[(long)i + 1];
    lVar6 = lVar7 + 1;
    lVar5 = lVar4;
    if (lVar6 <= lVar4) {
      lVar6 = lVar4;
    }
    do {
      lVar4 = lVar6;
      if (lVar7 < lVar5) break;
      lVar4 = lVar5 + 1;
      lVar3 = lVar5 + 1;
      lVar5 = lVar4;
    } while (piVar2[lVar3] != j);
  }
  return (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[lVar4];
}

Assistant:

double HPreData::getaij(int i, int j) {
	int k=ARstart[i];
    while (j != ARindex[k] && k<=ARstart[i+1])
            k++;
    if (k==ARstart[i+1]) {
    	//cout<<"Error: No such element in A: row "<<i<<", column "<<j<<endl;
    	//exit(0);
    	}
    return ARvalue[k];
}